

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

bool __thiscall wabt::anon_unknown_23::BinaryReader::IsConcreteType(BinaryReader *this,Type type)

{
  bool bVar1;
  Enum EVar2;
  bool local_29;
  BinaryReader *this_local;
  Type type_local;
  
  this_local._0_4_ = type.enum_;
  EVar2 = Type::operator_cast_to_Enum((Type *)&this_local);
  switch(EVar2) {
  case Exnref:
    bVar1 = Features::reference_types_enabled(&this->options_->features);
    local_29 = false;
    if (bVar1) {
      local_29 = Features::exceptions_enabled(&this->options_->features);
    }
    this_local._7_1_ = local_29;
    break;
  default:
    this_local._7_1_ = false;
    break;
  case Nullref:
  case Anyref:
  case Funcref:
    this_local._7_1_ = Features::reference_types_enabled(&this->options_->features);
    break;
  case V128:
    this_local._7_1_ = Features::simd_enabled(&this->options_->features);
    break;
  case F64:
  case F32:
  case I64:
  case I32:
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool BinaryReader::IsConcreteType(Type type) {
  switch (type) {
    case Type::I32:
    case Type::I64:
    case Type::F32:
    case Type::F64:
      return true;

    case Type::V128:
      return options_.features.simd_enabled();

    case Type::Funcref:
    case Type::Anyref:
    case Type::Nullref:
      return options_.features.reference_types_enabled();

    case Type::Exnref:
      return options_.features.reference_types_enabled() &&
             options_.features.exceptions_enabled();

    default:
      return false;
  }
}